

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void sendNode<cpprofiler::Node&>(Node *node)

{
  ulong uVar1;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  int in_ESI;
  Node *in_RDI;
  int in_R8D;
  ostream *in_stack_00000078;
  Node *in_stack_00000080;
  
  if (so.print_nodes) {
    uVar1 = std::ofstream::is_open();
    if ((uVar1 & 1) == 0) {
      std::ofstream::open(node_stream,0x2c07da);
    }
    in_ESI = 0x321d58;
    printNode<cpprofiler::Node&>(in_stack_00000080,in_stack_00000078);
    in_RDX = extraout_RDX;
    if ((so.debug & 1U) != 0) {
      in_ESI = 0x323580;
      printNode<cpprofiler::Node&>(in_stack_00000080,in_stack_00000078);
      in_RDX = extraout_RDX_00;
    }
  }
  cpprofiler::Node::send(in_RDI,in_ESI,in_RDX,in_RCX,in_R8D);
  return;
}

Assistant:

static void sendNode(T&& node) {
	if (so.print_nodes) {
		if (!node_stream.is_open()) {
			node_stream.open("node-log.log");
		}
		printNode(node, node_stream);
		if (so.debug) {
			printNode(node, std::cerr);
		}
	}
	node.send();
}